

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  uchar uVar2;
  unsigned_short grey;
  int iVar3;
  uchar uVar6;
  uint uVar4;
  size_t sVar5;
  uchar uVar10;
  size_t sVar8;
  LodePNGColorMode *pLVar9;
  uint bits;
  uchar uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_d8;
  unsigned_short local_d6;
  unsigned_short local_d4;
  unsigned_short local_d2;
  uchar *local_d0;
  LodePNGColorMode *local_c8;
  ulong local_c0;
  ColorTree local_b8;
  uchar uVar7;
  
  local_d0 = out;
  iVar3 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar3 != 0) {
    sVar5 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar5 == 0) {
      return 0;
    }
    sVar8 = 0;
    do {
      local_d0[sVar8] = in[sVar8];
      sVar8 = sVar8 + 1;
    } while (sVar5 != sVar8);
    return 0;
  }
  local_c0 = (ulong)(h * w);
  local_c8 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar12 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    uVar14 = mode_out->palettesize;
    pLVar9 = mode_out;
    if (uVar14 == 0) {
      uVar14 = mode_in->palettesize;
      pLVar9 = mode_in;
    }
    if (uVar14 < uVar12) {
      uVar12 = uVar14;
    }
    puVar1 = pLVar9->palette;
    local_b8.children[0xe] = (ColorTree *)0x0;
    local_b8.children[0xf] = (ColorTree *)0x0;
    local_b8.children[0xc] = (ColorTree *)0x0;
    local_b8.children[0xd] = (ColorTree *)0x0;
    local_b8.children[10] = (ColorTree *)0x0;
    local_b8.children[0xb] = (ColorTree *)0x0;
    local_b8.children[8] = (ColorTree *)0x0;
    local_b8.children[9] = (ColorTree *)0x0;
    local_b8.children[6] = (ColorTree *)0x0;
    local_b8.children[7] = (ColorTree *)0x0;
    local_b8.children[4] = (ColorTree *)0x0;
    local_b8.children[5] = (ColorTree *)0x0;
    local_b8.children[2] = (ColorTree *)0x0;
    local_b8.children[3] = (ColorTree *)0x0;
    local_b8.children[0] = (ColorTree *)0x0;
    local_b8.children[1] = (ColorTree *)0x0;
    local_b8.index = -1;
    if (uVar14 != 0) {
      uVar14 = 0;
      do {
        color_tree_add(&local_b8,puVar1[uVar14 * 4],puVar1[uVar14 * 4 + 1],puVar1[uVar14 * 4 + 2],
                       puVar1[uVar14 * 4 + 3],(uint)uVar14);
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
  }
  pLVar9 = local_c8;
  if (mode_out->bitdepth == 0x10 && local_c8->bitdepth == 0x10) {
    if (local_c0 != 0) {
      lVar13 = 0;
      sVar5 = 0;
      do {
        local_d2 = 0;
        local_d4 = 0;
        local_d6 = 0;
        local_d8 = 0;
        getPixelColorRGBA16(&local_d2,&local_d4,&local_d6,&local_d8,in,sVar5,local_c8);
        uVar2 = (uchar)local_d2;
        uVar6 = (uchar)(local_d2 >> 8);
        uVar10 = (uchar)(local_d8 >> 8);
        uVar11 = (uchar)(local_d4 >> 8);
        uVar7 = (uchar)(local_d6 >> 8);
        switch(mode_out->colortype) {
        case LCT_GREY:
          *(unsigned_short *)(local_d0 + sVar5 * 2) = local_d2 << 8 | local_d2 >> 8;
          break;
        case LCT_RGB:
          local_d0[lVar13] = uVar6;
          local_d0[lVar13 + 1] = uVar2;
          local_d0[lVar13 + 2] = uVar11;
          local_d0[lVar13 + 3] = (uchar)local_d4;
          local_d0[lVar13 + 4] = uVar7;
          local_d0[lVar13 + 5] = (uchar)local_d6;
          break;
        case LCT_GREY_ALPHA:
          local_d0[sVar5 * 4] = uVar6;
          local_d0[sVar5 * 4 + 1] = uVar2;
          local_d0[sVar5 * 4 + 2] = uVar10;
          local_d0[sVar5 * 4 + 3] = (uchar)local_d8;
          break;
        case LCT_RGBA:
          local_d0[sVar5 * 8] = uVar6;
          local_d0[sVar5 * 8 + 1] = uVar2;
          local_d0[sVar5 * 8 + 2] = uVar11;
          local_d0[sVar5 * 8 + 3] = (uchar)local_d4;
          local_d0[sVar5 * 8 + 4] = uVar7;
          local_d0[sVar5 * 8 + 5] = (uchar)local_d6;
          local_d0[sVar5 * 8 + 6] = uVar10;
          local_d0[sVar5 * 8 + 7] = (uchar)local_d8;
        }
        sVar5 = sVar5 + 1;
        lVar13 = lVar13 + 6;
      } while (local_c0 != sVar5);
      uVar4 = 0;
      goto LAB_00117f7c;
    }
  }
  else {
    if (mode_out->bitdepth == 8) {
      if (mode_out->colortype == LCT_RGB) {
        uVar4 = 0;
        getPixelColorsRGBA8(local_d0,local_c0,0,in,local_c8);
        goto LAB_00117f7c;
      }
      if (mode_out->colortype == LCT_RGBA) {
        getPixelColorsRGBA8(local_d0,local_c0,1,in,local_c8);
        goto LAB_00117f7a;
      }
    }
    uVar4 = 0;
    local_d2 = local_d2 & 0xff00;
    local_d4 = local_d4 & 0xff00;
    local_d6 = local_d6 & 0xff00;
    local_d8 = local_d8 & 0xff00;
    if (local_c0 == 0) goto LAB_00117f7c;
    lVar13 = 1;
    lVar15 = 0;
    sVar5 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_d2,(uchar *)&local_d4,(uchar *)&local_d6,(uchar *)&local_d8
                         ,in,sVar5,pLVar9);
      switch(mode_out->colortype) {
      case LCT_GREY:
        bits = mode_out->bitdepth;
        if (bits == 0x10) {
          local_d0[lVar13] = (byte)local_d2;
          local_d0[lVar13 + -1] = (byte)local_d2;
        }
        else if (bits == 8) {
          local_d0[sVar5] = (byte)local_d2;
        }
        else {
          uVar4 = ~(-1 << ((byte)bits & 0x1f)) & (uint)((byte)local_d2 >> (8 - (byte)bits & 0x1f));
LAB_00117f55:
          addColorBits(local_d0,sVar5,bits,uVar4);
        }
        break;
      case LCT_RGB:
        if (mode_out->bitdepth == 8) {
          local_d0[lVar15] = (byte)local_d2;
          local_d0[lVar15 + 1] = (uchar)local_d4;
          local_d0[lVar15 + 2] = (uchar)local_d6;
        }
        else {
          local_d0[lVar15 * 2 + 1] = (byte)local_d2;
          local_d0[lVar15 * 2] = (byte)local_d2;
          local_d0[lVar15 * 2 + 3] = (uchar)local_d4;
          local_d0[lVar15 * 2 + 2] = (uchar)local_d4;
          local_d0[lVar15 * 2 + 5] = (uchar)local_d6;
          local_d0[lVar15 * 2 + 4] = (uchar)local_d6;
        }
        break;
      case LCT_PALETTE:
        uVar4 = color_tree_get(&local_b8,(byte)local_d2,(uchar)local_d4,(uchar)local_d6,
                               (uchar)local_d8);
        if ((int)uVar4 < 0) {
          uVar4 = 0x52;
          goto LAB_00117f7c;
        }
        bits = mode_out->bitdepth;
        if (bits != 8) goto LAB_00117f55;
        local_d0[sVar5] = (uchar)uVar4;
        break;
      case LCT_GREY_ALPHA:
        if (mode_out->bitdepth == 0x10) {
          local_d0[lVar13 * 2 + -1] = (byte)local_d2;
          local_d0[lVar13 * 2 + -2] = (byte)local_d2;
          local_d0[lVar13 * 2 + 1] = (uchar)local_d8;
          local_d0[lVar13 * 2] = (uchar)local_d8;
        }
        else if (mode_out->bitdepth == 8) {
          local_d0[lVar13 + -1] = (byte)local_d2;
          local_d0[lVar13] = (uchar)local_d8;
        }
        break;
      case LCT_RGBA:
        if (mode_out->bitdepth == 8) {
          local_d0[lVar13 * 2 + -2] = (byte)local_d2;
          local_d0[lVar13 * 2 + -1] = (uchar)local_d4;
          local_d0[lVar13 * 2] = (uchar)local_d6;
          local_d0[lVar13 * 2 + 1] = (uchar)local_d8;
        }
        else {
          local_d0[lVar13 * 4 + -3] = (byte)local_d2;
          local_d0[lVar13 * 4 + -4] = (byte)local_d2;
          local_d0[lVar13 * 4 + -1] = (uchar)local_d4;
          local_d0[lVar13 * 4 + -2] = (uchar)local_d4;
          local_d0[lVar13 * 4 + 1] = (uchar)local_d6;
          local_d0[lVar13 * 4] = (uchar)local_d6;
          local_d0[lVar13 * 4 + 3] = (uchar)local_d8;
          local_d0[lVar13 * 4 + 2] = (uchar)local_d8;
        }
      }
      sVar5 = sVar5 + 1;
      lVar13 = lVar13 + 2;
      lVar15 = lVar15 + 3;
    } while (local_c0 != sVar5);
  }
LAB_00117f7a:
  uVar4 = 0;
LAB_00117f7c:
  if (mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&local_b8);
  }
  return uVar4;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;
  unsigned error = 0;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
      if (error) break;
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return error;
}